

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O3

void mserialize::serialize<(anonymous_namespace)::Tree,OutputStream>(Tree *in,OutputStream *ostream)

{
  undefined1 local_14 [4];
  
  std::ostream::write((char *)(ostream->stream + 0x10),(long)local_14);
  detail::BuiltinSerializer<(anonymous_namespace)::Tree_*,_void>::serialize<OutputStream>
            (&in->left,ostream);
  detail::BuiltinSerializer<(anonymous_namespace)::Tree_*,_void>::serialize<OutputStream>
            (&in->right,ostream);
  return;
}

Assistant:

void serialize(const T& in, OutputStream& ostream)
{
  detail::Serializer<T>::type::serialize(in, ostream);
}